

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O2

void __thiscall
higan::MultiplexEpoll::FillActiveChannelList
          (MultiplexEpoll *this,int active_event_num,ChannelList *active_channel_list)

{
  pointer peVar1;
  ulong uVar2;
  ulong uVar3;
  Channel *local_38;
  Channel *channel;
  
  if (active_channel_list != (ChannelList *)0x0) {
    uVar3 = 0;
    uVar2 = (ulong)(uint)active_event_num;
    if (active_event_num < 1) {
      uVar2 = uVar3;
    }
    for (; uVar2 * 0xc - uVar3 != 0; uVar3 = uVar3 + 0xc) {
      peVar1 = (this->epoll_events_).super__Vector_base<epoll_event,_std::allocator<epoll_event>_>.
               _M_impl.super__Vector_impl_data._M_start;
      local_38 = *(Channel **)((long)&peVar1->data + uVar3);
      if (local_38 != (Channel *)0x0) {
        Channel::SetChannelReadable
                  (local_38,(bool)((byte)*(undefined4 *)((long)&peVar1->events + uVar3) & 1));
        Channel::SetChannelWritable
                  (local_38,SUB41((*(uint *)((long)&((this->epoll_events_).
                                                                                                          
                                                  super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->events
                                            + uVar3) & 4) >> 2,0));
        Channel::SetChannelError
                  (local_38,(*(byte *)((long)&((this->epoll_events_).
                                               super__Vector_base<epoll_event,_std::allocator<epoll_event>_>
                                               ._M_impl.super__Vector_impl_data._M_start)->events +
                                      uVar3) & 0x18) != 0);
        std::vector<higan::Channel_*,_std::allocator<higan::Channel_*>_>::push_back
                  (active_channel_list,&local_38);
      }
    }
  }
  return;
}

Assistant:

void MultiplexEpoll::FillActiveChannelList(int active_event_num, MultiplexBase::ChannelList* active_channel_list)
{
	if (active_channel_list == nullptr)
	{
		return;
	}

	for (int i = 0; i < active_event_num; ++i)
	{

		Channel* channel = static_cast<Channel*>(epoll_events_[i].data.ptr);

		if (channel == nullptr)
		{
			continue;
		}

		channel->SetChannelReadable(epoll_events_[i].events & EPOLLIN);
		channel->SetChannelWritable(epoll_events_[i].events & EPOLLOUT);
		channel->SetChannelError(epoll_events_[i].events & (EPOLLERR | EPOLLHUP));

		active_channel_list->push_back(channel);
	}
}